

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O1

boolean decode_mcu_AC_refine(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  jpeg_entropy_decoder *pjVar4;
  int *piVar5;
  JBLOCKROW paJVar6;
  jpeg_error_mgr *pjVar7;
  bool bVar8;
  short sVar9;
  short sVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Var16;
  
  pjVar4 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    if (*(int *)((long)&pjVar4[4].start_pass + 4) == 0) {
      process_restart(cinfo);
    }
    piVar5 = (int *)((long)&pjVar4[4].start_pass + 4);
    *piVar5 = *piVar5 + -1;
  }
  if (*(int *)&pjVar4[2].start_pass != -1) {
    bVar2 = (byte)cinfo->Al;
    piVar5 = cinfo->natural_order;
    paJVar6 = *MCU_data;
    uVar14 = cinfo->Se;
    if (0 < (int)uVar14) {
      do {
        if ((*paJVar6)[piVar5[uVar14]] != 0) goto LAB_00114108;
        bVar8 = 1 < (int)uVar14;
        uVar14 = uVar14 - 1;
      } while (bVar8);
      uVar14 = 0;
    }
LAB_00114108:
    iVar15 = cinfo->Ss;
    if (iVar15 <= cinfo->Se) {
      iVar3 = cinfo->cur_comp_info[0]->ac_tbl_no;
      do {
        p_Var16 = (&pjVar4[0xc].decode_mcu)[iVar3];
        lVar13 = (long)(iVar15 * 3 + -3);
        if (((int)uVar14 < iVar15) &&
           (iVar11 = arith_decode(cinfo,(uchar *)(p_Var16 + lVar13)), iVar11 != 0)) {
          return 1;
        }
        p_Var16 = p_Var16 + lVar13 + 2;
        lVar13 = 0;
        while( true ) {
          iVar11 = piVar5[iVar15 + lVar13];
          sVar10 = (short)(1 << (bVar2 & 0x1f));
          sVar9 = (short)(-1 << (bVar2 & 0x1f));
          if ((*paJVar6)[iVar11] != 0) break;
          iVar12 = arith_decode(cinfo,(uchar *)(p_Var16 + -1));
          if (iVar12 != 0) {
            iVar12 = arith_decode(cinfo,(uchar *)&pjVar4[0x14].decode_mcu);
            if (iVar12 != 0) {
              sVar10 = sVar9;
            }
            (*paJVar6)[iVar11] = sVar10;
            goto LAB_0011425e;
          }
          lVar1 = iVar15 + lVar13;
          lVar13 = lVar13 + 1;
          p_Var16 = p_Var16 + 3;
          if (cinfo->Se <= lVar1) {
            pjVar7 = cinfo->err;
            pjVar7->msg_code = 0x75;
            (*pjVar7->emit_message)((j_common_ptr)cinfo,-1);
            *(undefined4 *)&pjVar4[2].start_pass = 0xffffffff;
            return 1;
          }
        }
        iVar12 = arith_decode(cinfo,(uchar *)p_Var16);
        if (iVar12 != 0) {
          if (-1 < (*paJVar6)[iVar11]) {
            sVar9 = sVar10;
          }
          (*paJVar6)[iVar11] = (*paJVar6)[iVar11] + sVar9;
        }
LAB_0011425e:
        iVar11 = iVar15 + (int)lVar13;
        iVar15 = iVar15 + (int)lVar13 + 1;
      } while (iVar11 < cinfo->Se);
    }
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_AC_refine (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  JBLOCKROW block;
  JCOEFPTR thiscoef;
  unsigned char *st;
  int tbl, k, kex;
  int p1, m1;
  const int * natural_order;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;	/* if error do nothing */

  natural_order = cinfo->natural_order;

  /* There is always only one block per MCU */
  block = MCU_data[0];
  tbl = cinfo->cur_comp_info[0]->ac_tbl_no;

  p1 = 1 << cinfo->Al;		/* 1 in the bit position being coded */
  m1 = (-1) << cinfo->Al;	/* -1 in the bit position being coded */

  /* Establish EOBx (previous stage end-of-block) index */
  for (kex = cinfo->Se; kex > 0; kex--)
    if ((*block)[natural_order[kex]]) break;

  for (k = cinfo->Ss; k <= cinfo->Se; k++) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    if (k > kex)
      if (arith_decode(cinfo, st)) break;	/* EOB flag */
    for (;;) {
      thiscoef = *block + natural_order[k];
      if (*thiscoef) {				/* previously nonzero coef */
	if (arith_decode(cinfo, st + 2)) {
	  if (*thiscoef < 0)
	    *thiscoef += m1;
	  else
	    *thiscoef += p1;
	}
	break;
      }
      if (arith_decode(cinfo, st + 1)) {	/* newly nonzero coef */
	if (arith_decode(cinfo, entropy->fixed_bin))
	  *thiscoef = m1;
	else
	  *thiscoef = p1;
	break;
      }
      st += 3; k++;
      if (k > cinfo->Se) {
	WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	entropy->ct = -1;			/* spectral overflow */
	return TRUE;
      }
    }
  }

  return TRUE;
}